

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

void __thiscall Wasm::WasmBytecodeGenerator::PrintTypeStack(WasmBytecodeGenerator *this)

{
  WasmType type;
  EmitInfo *pEVar1;
  char16 *form;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  Output::Print(L"[");
  iVar3 = -1;
  iVar5 = -1;
  do {
    iVar4 = iVar5;
    pEVar1 = JsUtil::ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>::Item
                       ((ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer> *)
                        &this->m_evalStack,
                        (this->m_evalStack).list.
                        super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.
                        count + iVar3);
    iVar5 = iVar4 + 1;
    iVar3 = iVar3 + -1;
  } while (pEVar1->type != Limit);
  if (-1 < iVar4) {
    iVar3 = -iVar5;
    bVar2 = true;
    do {
      pEVar1 = JsUtil::ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>::Item
                         ((ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer> *)
                          &this->m_evalStack,
                          (this->m_evalStack).list.
                          super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>
                          .count + iVar3);
      type = pEVar1->type;
      if (!bVar2) {
        Output::Print(L", ");
      }
      form = WasmTypes::GetTypeName(type);
      bVar2 = false;
      Output::Print(form);
      iVar3 = iVar3 + 1;
      iVar5 = iVar5 + -1;
    } while (0 < iVar5);
  }
  Output::Print(L"]");
  return;
}

Assistant:

void WasmBytecodeGenerator::PrintTypeStack() const
{
    WriteTypeStack([](const char16* msg) { Output::Print(msg); });
}